

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HighsHashTree.h
# Opt level: O1

void __thiscall
HighsHashTree<std::pair<int,_int>,_double>::InnerLeaf<3>::InnerLeaf<2>
          (InnerLeaf<3> *this,InnerLeaf<2> *other)

{
  int iVar1;
  long lVar2;
  difference_type __d;
  long lVar3;
  
  lVar2 = 0x14c;
  do {
    *(undefined8 *)((long)(this->hashes)._M_elems + lVar2 + -0x14) = 0;
    lVar2 = lVar2 + 0x10;
  } while (lVar2 != 0x3ac);
  (this->occupation).occupation = (other->occupation).occupation;
  iVar1 = other->size;
  this->size = iVar1;
  if (iVar1 + 1 != 0) {
    memmove(&this->hashes,&other->hashes,(long)(iVar1 + 1) << 3);
  }
  if (0 < iVar1) {
    lVar3 = (long)iVar1 + 1;
    lVar2 = 0;
    do {
      *(undefined4 *)((long)&(this->entries)._M_elems[0].key_.first + lVar2) =
           *(undefined4 *)((long)&(other->entries)._M_elems[0].key_.first + lVar2);
      *(undefined4 *)((long)&(this->entries)._M_elems[0].key_.second + lVar2) =
           *(undefined4 *)((long)&(other->entries)._M_elems[0].key_.second + lVar2);
      *(undefined8 *)((long)&(this->entries)._M_elems[0].value_ + lVar2) =
           *(undefined8 *)((long)&(other->entries)._M_elems[0].value_ + lVar2);
      lVar3 = lVar3 + -1;
      lVar2 = lVar2 + 0x10;
    } while (1 < lVar3);
  }
  return;
}

Assistant:

InnerLeaf(InnerLeaf<kOtherSize>&& other) {
      assert(other.size <= capacity());
      occupation = other.occupation;
      size = other.size;
      std::copy(other.hashes.cbegin(),
                std::next(other.hashes.cbegin(), size + 1), hashes.begin());
      std::move(other.entries.begin(), std::next(other.entries.begin(), size),
                entries.begin());
    }